

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getattributes(HSQUIRRELVM v,SQInteger idx)

{
  SQClass *this;
  bool bVar1;
  SQObjectPtr *key;
  SQRESULT SVar2;
  SQObjectPtr attrs;
  SQObjectPtr *o;
  
  o = (SQObjectPtr *)0x0;
  bVar1 = sq_aux_gettypedarg(v,idx,OT_CLASS,&o);
  SVar2 = -1;
  if (!bVar1) {
    return -1;
  }
  key = SQVM::GetUp(v,-1);
  attrs.super_SQObject._type = OT_NULL;
  attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
  this = (o->super_SQObject)._unVal.pClass;
  if ((key->super_SQObject)._type == OT_NULL) {
    SQObjectPtr::operator=(&attrs,&this->_attributes);
  }
  else {
    bVar1 = SQClass::GetAttributes(this,key,&attrs);
    if (!bVar1) {
      sq_throwerror(v,"wrong index");
      goto LAB_00115a27;
    }
  }
  SQVM::Pop(v);
  SQVM::Push(v,&attrs);
  SVar2 = 0;
LAB_00115a27:
  SQObjectPtr::~SQObjectPtr(&attrs);
  return SVar2;
}

Assistant:

SQRESULT sq_getattributes(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    SQObjectPtr &key = stack_get(v,-1);
    SQObjectPtr attrs;
    if(sq_type(key) == OT_NULL) {
        attrs = _class(*o)->_attributes;
        v->Pop();
        v->Push(attrs);
        return SQ_OK;
    }
    else if(_class(*o)->GetAttributes(key,attrs)) {
        v->Pop();
        v->Push(attrs);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong index"));
}